

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O1

vec3 __thiscall vera::Triangle::getClosestPoint(Triangle *this,vec3 *_p)

{
  float fVar1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar2;
  float fVar3;
  undefined8 uVar4;
  float fVar6;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar7;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar8;
  float fVar9;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  vec3 vVar17;
  vec3 local_40;
  vec3 local_30;
  vec3 local_20;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar5;
  
  fVar1 = this->m_vertices[0].field_0.x;
  fVar13 = this->m_vertices[0].field_1.y;
  uVar4._0_4_ = this->m_vertices[1].field_0.x - fVar1;
  aVar7.y = this->m_vertices[1].field_1.y - fVar13;
  uVar4._4_4_ = aVar7.y;
  fVar15 = this->m_vertices[0].field_2.z;
  aVar10.z = this->m_vertices[1].field_2.z - fVar15;
  local_40.field_0.x = this->m_vertices[2].field_0.x - fVar1;
  aVar8.y = this->m_vertices[2].field_1.y - fVar13;
  local_40.field_1.y = aVar8.y;
  local_40.field_2.z = this->m_vertices[2].field_2.z - fVar15;
  fVar16 = aVar8.y * aVar10.z - local_40.field_2.z * aVar7.y;
  fVar13 = local_40.field_2.z * uVar4._0_4_ - local_40.field_0.x * aVar10.z;
  fVar15 = local_40.field_0.x * aVar7.y - aVar8.y * uVar4._0_4_;
  fVar1 = fVar15 * fVar15 + fVar13 * fVar13 + fVar16 * fVar16;
  local_30._0_8_ = uVar4;
  local_30.field_2.z = aVar10.z;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  fVar11 = this->m_vertices[0].field_0.x;
  fVar12 = this->m_vertices[0].field_1.y;
  fVar14 = this->m_vertices[0].field_2.z;
  fVar6 = ((_p->field_2).z - fVar14) * fVar15 * fVar1 +
          ((_p->field_1).y - fVar12) * fVar13 * fVar1 + ((_p->field_0).x - fVar11) * fVar16 * fVar1;
  fVar16 = (_p->field_0).x - fVar16 * fVar1 * fVar6;
  fVar13 = (_p->field_1).y - fVar13 * fVar1 * fVar6;
  fVar1 = (_p->field_2).z - fVar6 * fVar15 * fVar1;
  local_20.field_0.x = fVar16 - fVar11;
  local_20.field_1.y = fVar13 - fVar12;
  local_20.field_2.z = fVar1 - fVar14;
  vVar17 = getBarycentric(&local_30,&local_40,&local_20);
  aVar5 = vVar17.field_2;
  aVar2 = vVar17.field_0;
  if (0.0 <= aVar2.x) {
    aVar8 = vVar17.field_1;
    if (0.0 <= aVar8.y) {
      if (0.0 <= aVar5.z) {
        fVar15 = this->m_vertices[2].field_0.x * aVar5.z +
                 this->m_vertices[1].field_0.x * aVar8.y + fVar11 * aVar2.x;
        fVar6 = this->m_vertices[2].field_1.y * aVar5.z +
                this->m_vertices[1].field_1.y * aVar8.y + fVar12 * aVar2.x;
        aVar10.z = aVar5.z * this->m_vertices[2].field_2.z +
                   aVar8.y * this->m_vertices[1].field_2.z + fVar14 * aVar2.x;
      }
      else {
        fVar11 = aVar10.z * aVar10.z + aVar7.y * aVar7.y + uVar4._0_4_ * uVar4._0_4_;
        if (fVar11 < 0.0) {
          fVar11 = sqrtf(fVar11);
        }
        else {
          fVar11 = SQRT(fVar11);
        }
        fVar15 = this->m_vertices[0].field_0.x;
        fVar6 = this->m_vertices[0].field_1.y;
        fVar12 = this->m_vertices[0].field_2.z;
        fVar13 = ((fVar1 - fVar12) * aVar10.z +
                 (fVar13 - fVar6) * aVar7.y + (fVar16 - fVar15) * uVar4._0_4_) / fVar11;
        fVar1 = fVar11;
        if (fVar13 <= fVar11) {
          fVar1 = fVar13;
        }
        if (fVar1 <= 0.0) {
          fVar1 = 0.0;
        }
        fVar1 = fVar1 / fVar11;
        fVar15 = uVar4._0_4_ * fVar1 + fVar15;
        fVar6 = aVar7.y * fVar1 + fVar6;
        aVar10.z = fVar1 * aVar10.z + fVar12;
      }
      goto LAB_0025294d;
    }
    fVar11 = fVar11 - this->m_vertices[2].field_0.x;
    fVar12 = fVar12 - this->m_vertices[2].field_1.y;
    fVar14 = fVar14 - this->m_vertices[2].field_2.z;
    fVar3 = fVar14 * fVar14 + fVar12 * fVar12 + fVar11 * fVar11;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar15 = this->m_vertices[2].field_0.x;
    fVar6 = this->m_vertices[2].field_1.y;
    fVar9 = this->m_vertices[2].field_2.z;
    fVar13 = ((fVar1 - fVar9) * fVar14 + (fVar13 - fVar6) * fVar12 + (fVar16 - fVar15) * fVar11) /
             fVar3;
    fVar1 = fVar3;
    if (fVar13 <= fVar3) {
      fVar1 = fVar13;
    }
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
  }
  else {
    fVar11 = this->m_vertices[2].field_0.x - this->m_vertices[1].field_0.x;
    fVar12 = this->m_vertices[2].field_1.y - this->m_vertices[1].field_1.y;
    fVar14 = this->m_vertices[2].field_2.z - this->m_vertices[1].field_2.z;
    fVar3 = fVar14 * fVar14 + fVar12 * fVar12 + fVar11 * fVar11;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar15 = this->m_vertices[1].field_0.x;
    fVar6 = this->m_vertices[1].field_1.y;
    fVar9 = this->m_vertices[1].field_2.z;
    fVar13 = ((fVar1 - fVar9) * fVar14 + (fVar13 - fVar6) * fVar12 + (fVar16 - fVar15) * fVar11) /
             fVar3;
    fVar1 = fVar3;
    if (fVar13 <= fVar3) {
      fVar1 = fVar13;
    }
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
  }
  fVar1 = fVar1 / fVar3;
  fVar15 = fVar11 * fVar1 + fVar15;
  fVar6 = fVar12 * fVar1 + fVar6;
  aVar10.z = fVar1 * fVar14 + fVar9;
LAB_0025294d:
  vVar17.field_1.y = fVar6;
  vVar17.field_0.x = fVar15;
  vVar17.field_2.z = aVar10.z;
  return vVar17;
}

Assistant:

glm::vec3 Triangle::getClosestPoint(const glm::vec3& _p) const {
    // https://github.com/nmoehrle/libacc/blob/master/primitives.h#L71
    glm::vec3 ab = m_vertices[1] - m_vertices[0];
    glm::vec3 ac = m_vertices[2] - m_vertices[0];
    glm::vec3 normal = glm::normalize( glm::cross(ac,ab) );

    glm::vec3 p = _p - glm::dot(normal, _p - m_vertices[0]) * normal;
    glm::vec3 ap = p - m_vertices[0];

    glm::vec3 bcoords = getBarycentric(ab, ac, ap);

    if (bcoords[0] < 0.0f) {
        glm::vec3 bc = m_vertices[2] - m_vertices[1];
        float n = glm::length( bc ); // bc.norm();
        float t = glm::max(0.0f, glm::min( glm::dot(bc, p - m_vertices[1]) / n, n));
        return m_vertices[1] + t / n * bc;
    }

    if (bcoords[1] < 0.0f) {
        glm::vec3 ca = m_vertices[0] - m_vertices[2];
        float n = glm::length( ca ); //ca.norm();
        float t = glm::max(0.0f, glm::min( glm::dot(ca, p - m_vertices[2]) / n, n));
        return m_vertices[2] + t / n * ca;
    }

    if (bcoords[2] < 0.0f) {
        //glm::vec3 ab = m_vertices[1] - m_vertices[0];
        float n = glm::length( ab ); //ab.norm();
        
        float t = glm::max(0.0f, glm::min( glm::dot(ab, p - m_vertices[0]) / n, n));
        return m_vertices[0] + t / n * ab;
    }

    return (m_vertices[0] * bcoords[0] + m_vertices[1] * bcoords[1] + m_vertices[2] * bcoords[2]);
}